

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

bool __thiscall
perfetto::protos::gen::TrackEvent::ParseFromArray(TrackEvent *this,void *raw,size_t size)

{
  byte bVar1;
  pointer puVar2;
  pointer plVar3;
  pointer pdVar4;
  pointer pDVar5;
  pointer pDVar6;
  iterator __position;
  iterator __position_00;
  iterator iVar7;
  bool bVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong *puVar12;
  ulong uVar13;
  double *pdVar14;
  unsigned_long *puVar15;
  _Head_base<0UL,_perfetto::protos::gen::TrackEvent_LegacyEvent_*,_false> _Var16;
  uint8_t cur_byte_2;
  ulong uVar17;
  uint8_t cur_byte_3;
  ulong *puVar18;
  uint8_t cur_byte;
  ulong uVar19;
  uint8_t cur_byte_1;
  pointer pDVar20;
  ulong *puVar21;
  Field local_90;
  string *local_80;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_70;
  vector<double,_std::allocator<double>_> *local_68;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_60;
  vector<long,_std::allocator<long>_> *local_58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  vector<perfetto::protos::gen::DebugAnnotation,_std::allocator<perfetto::protos::gen::DebugAnnotation>_>
  *local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  puVar2 = (this->category_iids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->category_iids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar2) {
    (this->category_iids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
    .super__Vector_impl_data._M_finish = puVar2;
  }
  local_38 = &this->categories_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(local_38,(this->categories_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  puVar2 = (this->extra_counter_track_uuids_).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->extra_counter_track_uuids_).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->extra_counter_track_uuids_).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  plVar3 = (this->extra_counter_values_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->extra_counter_values_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_finish != plVar3) {
    (this->extra_counter_values_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_finish = plVar3;
  }
  puVar2 = (this->extra_double_counter_track_uuids_).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->extra_double_counter_track_uuids_).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->extra_double_counter_track_uuids_).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  pdVar4 = (this->extra_double_counter_values_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->extra_double_counter_values_).super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_finish != pdVar4) {
    (this->extra_double_counter_values_).super__Vector_base<double,_std::allocator<double>_>._M_impl
    .super__Vector_impl_data._M_finish = pdVar4;
  }
  puVar2 = (this->flow_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->flow_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->flow_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  puVar2 = (this->terminating_flow_ids_).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->terminating_flow_ids_).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->terminating_flow_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar2;
  }
  pDVar5 = (this->debug_annotations_).
           super__Vector_base<perfetto::protos::gen::DebugAnnotation,_std::allocator<perfetto::protos::gen::DebugAnnotation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pDVar6 = (this->debug_annotations_).
           super__Vector_base<perfetto::protos::gen::DebugAnnotation,_std::allocator<perfetto::protos::gen::DebugAnnotation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pDVar20 = pDVar5;
  if (pDVar6 != pDVar5) {
    do {
      (**(pDVar20->super_CppMessageObj)._vptr_CppMessageObj)(pDVar20);
      pDVar20 = pDVar20 + 1;
    } while (pDVar20 != pDVar6);
    (this->debug_annotations_).
    super__Vector_base<perfetto::protos::gen::DebugAnnotation,_std::allocator<perfetto::protos::gen::DebugAnnotation>_>
    ._M_impl.super__Vector_impl_data._M_finish = pDVar5;
  }
  local_50 = &this->extra_counter_track_uuids_;
  local_58 = &this->extra_counter_values_;
  local_60 = &this->extra_double_counter_track_uuids_;
  local_68 = &this->extra_double_counter_values_;
  local_70 = &this->flow_ids_;
  local_78 = &this->terminating_flow_ids_;
  (this->unknown_fields_)._M_string_length = 0;
  local_40 = &this->debug_annotations_;
  local_48 = &this->unknown_fields_;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar12 = (ulong *)(size + (long)raw);
  do {
    if (puVar12 <= raw) goto switchD_00249672_caseD_3;
    bVar1 = (byte)*raw;
    uVar11 = (ulong)bVar1;
    puVar18 = (ulong *)((long)raw + 1);
    if ((char)bVar1 < '\0') {
      uVar11 = (ulong)(bVar1 & 0x7f);
      lVar10 = 7;
      do {
        if ((puVar12 <= puVar18) || (0x38 < lVar10 - 7U)) goto switchD_00249672_caseD_3;
        uVar9 = *puVar18;
        puVar18 = (ulong *)((long)puVar18 + 1);
        uVar11 = uVar11 | (ulong)((byte)uVar9 & 0x7f) << ((byte)lVar10 & 0x3f);
        lVar10 = lVar10 + 7;
      } while ((char)(byte)uVar9 < '\0');
    }
    uVar9 = uVar11 >> 3;
    if (((uint)uVar9 == 0) || (puVar12 <= puVar18)) goto switchD_00249672_caseD_3;
    switch((uint)uVar11 & 7) {
    case 0:
      uVar17 = 0;
      uVar13 = 0;
      while( true ) {
        puVar21 = (ulong *)((long)puVar18 + 1);
        uVar17 = (ulong)((byte)*puVar18 & 0x7f) << ((byte)uVar13 & 0x3f) | uVar17;
        if (-1 < (char)(byte)*puVar18) break;
        if ((puVar12 <= puVar21) ||
           (bVar8 = 0x38 < uVar13, uVar13 = uVar13 + 7, puVar18 = puVar21, bVar8))
        goto switchD_00249672_caseD_3;
      }
      uVar13 = uVar17 & 0xffffffff00000000;
      break;
    case 1:
      puVar21 = puVar18 + 1;
      if (puVar12 < puVar21) goto switchD_00249672_caseD_3;
      uVar17 = *puVar18;
      uVar13 = uVar17 & 0xffffffff00000000;
      break;
    case 2:
      puVar18 = (ulong *)((long)puVar18 + 1);
      uVar19 = 0;
      uVar17 = 0;
      puVar21 = puVar18;
      while (uVar19 = (ulong)(*(byte *)((long)puVar21 + -1) & 0x7f) << ((byte)uVar17 & 0x3f) |
                      uVar19, (char)*(byte *)((long)puVar21 + -1) < '\0') {
        if (puVar12 <= puVar21) goto switchD_00249672_caseD_3;
        puVar21 = (ulong *)((long)puVar21 + 1);
        puVar18 = (ulong *)((long)puVar18 + 1);
        bVar8 = 0x38 < uVar17;
        uVar17 = uVar17 + 7;
        if (bVar8) goto switchD_00249672_caseD_3;
      }
      if (uVar19 <= (ulong)((long)puVar12 - (long)puVar18)) {
        uVar13 = (ulong)puVar18 & 0xffffffff00000000;
        puVar21 = (ulong *)((long)puVar21 + uVar19);
        uVar17 = (ulong)puVar18 & 0xffffffff;
        goto LAB_0024974d;
      }
    default:
      goto switchD_00249672_caseD_3;
    case 5:
      puVar21 = (ulong *)((long)puVar18 + 4);
      if (puVar12 < puVar21) goto switchD_00249672_caseD_3;
      uVar17 = (ulong)(uint)*puVar18;
      uVar13 = 0;
    }
    uVar19 = 0;
LAB_0024974d:
    raw = puVar21;
  } while ((0xffff < (uint)uVar9) || (0xfffffff < uVar19));
  local_90.int_value_ = uVar13 | uVar17 & 0xffffffff;
  uVar17 = uVar9 << 0x20 | uVar19;
  uVar11 = uVar17 | (ulong)((uint)uVar11 & 7) << 0x30;
  local_90.size_ = (uint32_t)uVar19;
  local_90.type_ = (uint8_t)(uVar11 >> 0x30);
  local_90.id_ = (uint16_t)(uVar17 >> 0x20);
  if ((short)uVar9 != 0) {
    local_80 = &this->name_;
    do {
      if ((ushort)uVar9 < 0x2f) {
        (this->_has_field_).super__Base_bitset<1UL>._M_w =
             (this->_has_field_).super__Base_bitset<1UL>._M_w | 1L << ((byte)uVar9 & 0x3f);
      }
      raw = puVar21;
      switch((uint)uVar9 & 0xffff) {
      case 1:
        this->timestamp_delta_us_ = local_90.int_value_;
        break;
      case 2:
        this->thread_time_delta_us_ = local_90.int_value_;
        break;
      case 3:
        iVar7._M_current =
             (this->category_iids_).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (this->category_iids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<>
                    (&this->category_iids_,iVar7);
          puVar15 = (this->category_iids_).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        }
        else {
          *iVar7._M_current = 0;
          puVar15 = iVar7._M_current + 1;
          (this->category_iids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish = puVar15;
        }
        goto LAB_00249bb2;
      case 4:
        std::
        vector<perfetto::protos::gen::DebugAnnotation,_std::allocator<perfetto::protos::gen::DebugAnnotation>_>
        ::emplace_back<>(local_40);
        pDVar5 = (this->debug_annotations_).
                 super__Vector_base<perfetto::protos::gen::DebugAnnotation,_std::allocator<perfetto::protos::gen::DebugAnnotation>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        (*pDVar5[-1].super_CppMessageObj._vptr_CppMessageObj[4])
                  (pDVar5 + -1,local_90.int_value_,(ulong)local_90.size_);
        break;
      case 5:
        _Var16._M_head_impl =
             (TrackEvent_LegacyEvent *)
             (this->task_execution_).ptr_._M_t.
             super___uniq_ptr_impl<perfetto::protos::gen::TaskExecution,_std::default_delete<perfetto::protos::gen::TaskExecution>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::protos::gen::TaskExecution_*,_std::default_delete<perfetto::protos::gen::TaskExecution>_>
             .super__Head_base<0UL,_perfetto::protos::gen::TaskExecution_*,_false>._M_head_impl;
        goto LAB_00249b18;
      case 6:
        _Var16._M_head_impl =
             (this->legacy_event_).ptr_._M_t.
             super___uniq_ptr_impl<perfetto::protos::gen::TrackEvent_LegacyEvent,_std::default_delete<perfetto::protos::gen::TrackEvent_LegacyEvent>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::protos::gen::TrackEvent_LegacyEvent_*,_std::default_delete<perfetto::protos::gen::TrackEvent_LegacyEvent>_>
             .super__Head_base<0UL,_perfetto::protos::gen::TrackEvent_LegacyEvent_*,_false>.
             _M_head_impl;
        goto LAB_00249b18;
      default:
        protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>(&local_90,local_48);
        break;
      case 8:
        this->thread_instruction_count_delta_ = local_90.int_value_;
        break;
      case 9:
        this->type_ = (TrackEvent_Type)local_90.int_value_;
        break;
      case 10:
        this->name_iid_ = local_90.int_value_;
        break;
      case 0xb:
        this->track_uuid_ = local_90.int_value_;
        break;
      case 0xc:
        __position_00._M_current =
             (this->extra_counter_values_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position_00._M_current ==
            (this->extra_counter_values_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<long,_std::allocator<long>_>::_M_realloc_insert<>(local_58,__position_00);
          puVar15 = (unsigned_long *)
                    (this->extra_counter_values_).super__Vector_base<long,_std::allocator<long>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          *__position_00._M_current = 0;
          puVar15 = (unsigned_long *)(__position_00._M_current + 1);
          (this->extra_counter_values_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)puVar15;
        }
        goto LAB_00249bb2;
      case 0x10:
        this->timestamp_absolute_us_ = local_90.int_value_;
        break;
      case 0x11:
        this->thread_time_absolute_us_ = local_90.int_value_;
        break;
      case 0x14:
        this->thread_instruction_count_absolute_ = local_90.int_value_;
        break;
      case 0x15:
        _Var16._M_head_impl =
             (TrackEvent_LegacyEvent *)
             (this->log_message_).ptr_._M_t.
             super___uniq_ptr_impl<perfetto::protos::gen::LogMessage,_std::default_delete<perfetto::protos::gen::LogMessage>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::protos::gen::LogMessage_*,_std::default_delete<perfetto::protos::gen::LogMessage>_>
             .super__Head_base<0UL,_perfetto::protos::gen::LogMessage_*,_false>._M_head_impl;
        goto LAB_00249b18;
      case 0x16:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::emplace_back<>(local_38);
        protozero::Field::get
                  (&local_90,
                   (this->categories_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1);
        break;
      case 0x17:
        protozero::Field::get(&local_90,local_80);
        break;
      case 0x18:
        _Var16._M_head_impl =
             (TrackEvent_LegacyEvent *)
             (this->cc_scheduler_state_).ptr_._M_t.
             super___uniq_ptr_impl<perfetto::protos::gen::ChromeCompositorSchedulerState,_std::default_delete<perfetto::protos::gen::ChromeCompositorSchedulerState>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeCompositorSchedulerState_*,_std::default_delete<perfetto::protos::gen::ChromeCompositorSchedulerState>_>
             .super__Head_base<0UL,_perfetto::protos::gen::ChromeCompositorSchedulerState_*,_false>.
             _M_head_impl;
        goto LAB_00249b18;
      case 0x19:
        _Var16._M_head_impl =
             (TrackEvent_LegacyEvent *)
             (this->chrome_user_event_).ptr_._M_t.
             super___uniq_ptr_impl<perfetto::protos::gen::ChromeUserEvent,_std::default_delete<perfetto::protos::gen::ChromeUserEvent>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeUserEvent_*,_std::default_delete<perfetto::protos::gen::ChromeUserEvent>_>
             .super__Head_base<0UL,_perfetto::protos::gen::ChromeUserEvent_*,_false>._M_head_impl;
        goto LAB_00249b18;
      case 0x1a:
        _Var16._M_head_impl =
             (TrackEvent_LegacyEvent *)
             (this->chrome_keyed_service_).ptr_._M_t.
             super___uniq_ptr_impl<perfetto::protos::gen::ChromeKeyedService,_std::default_delete<perfetto::protos::gen::ChromeKeyedService>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeKeyedService_*,_std::default_delete<perfetto::protos::gen::ChromeKeyedService>_>
             .super__Head_base<0UL,_perfetto::protos::gen::ChromeKeyedService_*,_false>._M_head_impl
        ;
        goto LAB_00249b18;
      case 0x1b:
        _Var16._M_head_impl =
             (TrackEvent_LegacyEvent *)
             (this->chrome_legacy_ipc_).ptr_._M_t.
             super___uniq_ptr_impl<perfetto::protos::gen::ChromeLegacyIpc,_std::default_delete<perfetto::protos::gen::ChromeLegacyIpc>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeLegacyIpc_*,_std::default_delete<perfetto::protos::gen::ChromeLegacyIpc>_>
             .super__Head_base<0UL,_perfetto::protos::gen::ChromeLegacyIpc_*,_false>._M_head_impl;
        goto LAB_00249b18;
      case 0x1c:
        _Var16._M_head_impl =
             (TrackEvent_LegacyEvent *)
             (this->chrome_histogram_sample_).ptr_._M_t.
             super___uniq_ptr_impl<perfetto::protos::gen::ChromeHistogramSample,_std::default_delete<perfetto::protos::gen::ChromeHistogramSample>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeHistogramSample_*,_std::default_delete<perfetto::protos::gen::ChromeHistogramSample>_>
             .super__Head_base<0UL,_perfetto::protos::gen::ChromeHistogramSample_*,_false>.
             _M_head_impl;
        goto LAB_00249b18;
      case 0x1d:
        _Var16._M_head_impl =
             (TrackEvent_LegacyEvent *)
             (this->chrome_latency_info_).ptr_._M_t.
             super___uniq_ptr_impl<perfetto::protos::gen::ChromeLatencyInfo,_std::default_delete<perfetto::protos::gen::ChromeLatencyInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeLatencyInfo_*,_std::default_delete<perfetto::protos::gen::ChromeLatencyInfo>_>
             .super__Head_base<0UL,_perfetto::protos::gen::ChromeLatencyInfo_*,_false>._M_head_impl;
        goto LAB_00249b18;
      case 0x1e:
        this->counter_value_ = local_90.int_value_;
        break;
      case 0x1f:
        iVar7._M_current =
             (this->extra_counter_track_uuids_).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (this->extra_counter_track_uuids_).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<>
                    (local_50,iVar7);
          puVar15 = (this->extra_counter_track_uuids_).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        }
        else {
          *iVar7._M_current = 0;
          puVar15 = iVar7._M_current + 1;
          (this->extra_counter_track_uuids_).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar15;
        }
        goto LAB_00249bb2;
      case 0x20:
        _Var16._M_head_impl =
             (TrackEvent_LegacyEvent *)
             (this->chrome_frame_reporter_).ptr_._M_t.
             super___uniq_ptr_impl<perfetto::protos::gen::ChromeFrameReporter,_std::default_delete<perfetto::protos::gen::ChromeFrameReporter>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeFrameReporter_*,_std::default_delete<perfetto::protos::gen::ChromeFrameReporter>_>
             .super__Head_base<0UL,_perfetto::protos::gen::ChromeFrameReporter_*,_false>.
             _M_head_impl;
        goto LAB_00249b18;
      case 0x21:
        _Var16._M_head_impl =
             (TrackEvent_LegacyEvent *)
             (this->source_location_).ptr_._M_t.
             super___uniq_ptr_impl<perfetto::protos::gen::SourceLocation,_std::default_delete<perfetto::protos::gen::SourceLocation>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::protos::gen::SourceLocation_*,_std::default_delete<perfetto::protos::gen::SourceLocation>_>
             .super__Head_base<0UL,_perfetto::protos::gen::SourceLocation_*,_false>._M_head_impl;
        goto LAB_00249b18;
      case 0x22:
        this->source_location_iid_ = local_90.int_value_;
        break;
      case 0x23:
        _Var16._M_head_impl =
             (TrackEvent_LegacyEvent *)
             (this->chrome_message_pump_).ptr_._M_t.
             super___uniq_ptr_impl<perfetto::protos::gen::ChromeMessagePump,_std::default_delete<perfetto::protos::gen::ChromeMessagePump>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeMessagePump_*,_std::default_delete<perfetto::protos::gen::ChromeMessagePump>_>
             .super__Head_base<0UL,_perfetto::protos::gen::ChromeMessagePump_*,_false>._M_head_impl;
        goto LAB_00249b18;
      case 0x24:
        iVar7._M_current =
             (this->flow_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (this->flow_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<>
                    (local_70,iVar7);
          puVar15 = (this->flow_ids_).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        }
        else {
          *iVar7._M_current = 0;
          puVar15 = iVar7._M_current + 1;
          (this->flow_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish = puVar15;
        }
        goto LAB_00249bb2;
      case 0x26:
        _Var16._M_head_impl =
             (TrackEvent_LegacyEvent *)
             (this->chrome_mojo_event_info_).ptr_._M_t.
             super___uniq_ptr_impl<perfetto::protos::gen::ChromeMojoEventInfo,_std::default_delete<perfetto::protos::gen::ChromeMojoEventInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeMojoEventInfo_*,_std::default_delete<perfetto::protos::gen::ChromeMojoEventInfo>_>
             .super__Head_base<0UL,_perfetto::protos::gen::ChromeMojoEventInfo_*,_false>.
             _M_head_impl;
        goto LAB_00249b18;
      case 0x27:
        _Var16._M_head_impl =
             (TrackEvent_LegacyEvent *)
             (this->chrome_application_state_info_).ptr_._M_t.
             super___uniq_ptr_impl<perfetto::protos::gen::ChromeApplicationStateInfo,_std::default_delete<perfetto::protos::gen::ChromeApplicationStateInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeApplicationStateInfo_*,_std::default_delete<perfetto::protos::gen::ChromeApplicationStateInfo>_>
             .super__Head_base<0UL,_perfetto::protos::gen::ChromeApplicationStateInfo_*,_false>.
             _M_head_impl;
        goto LAB_00249b18;
      case 0x28:
        _Var16._M_head_impl =
             (TrackEvent_LegacyEvent *)
             (this->chrome_renderer_scheduler_state_).ptr_._M_t.
             super___uniq_ptr_impl<perfetto::protos::gen::ChromeRendererSchedulerState,_std::default_delete<perfetto::protos::gen::ChromeRendererSchedulerState>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeRendererSchedulerState_*,_std::default_delete<perfetto::protos::gen::ChromeRendererSchedulerState>_>
             .super__Head_base<0UL,_perfetto::protos::gen::ChromeRendererSchedulerState_*,_false>.
             _M_head_impl;
        goto LAB_00249b18;
      case 0x29:
        _Var16._M_head_impl =
             (TrackEvent_LegacyEvent *)
             (this->chrome_window_handle_event_info_).ptr_._M_t.
             super___uniq_ptr_impl<perfetto::protos::gen::ChromeWindowHandleEventInfo,_std::default_delete<perfetto::protos::gen::ChromeWindowHandleEventInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeWindowHandleEventInfo_*,_std::default_delete<perfetto::protos::gen::ChromeWindowHandleEventInfo>_>
             .super__Head_base<0UL,_perfetto::protos::gen::ChromeWindowHandleEventInfo_*,_false>.
             _M_head_impl;
        goto LAB_00249b18;
      case 0x2a:
        iVar7._M_current =
             (this->terminating_flow_ids_).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (this->terminating_flow_ids_).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<>
                    (local_78,iVar7);
          puVar15 = (this->terminating_flow_ids_).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        }
        else {
          *iVar7._M_current = 0;
          puVar15 = iVar7._M_current + 1;
          (this->terminating_flow_ids_).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar15;
        }
        goto LAB_00249bb2;
      case 0x2b:
        _Var16._M_head_impl =
             (TrackEvent_LegacyEvent *)
             (this->chrome_content_settings_event_info_).ptr_._M_t.
             super___uniq_ptr_impl<perfetto::protos::gen::ChromeContentSettingsEventInfo,_std::default_delete<perfetto::protos::gen::ChromeContentSettingsEventInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeContentSettingsEventInfo_*,_std::default_delete<perfetto::protos::gen::ChromeContentSettingsEventInfo>_>
             .super__Head_base<0UL,_perfetto::protos::gen::ChromeContentSettingsEventInfo_*,_false>.
             _M_head_impl;
LAB_00249b18:
        (*((_Var16._M_head_impl)->super_CppMessageObj)._vptr_CppMessageObj[4])
                  (_Var16._M_head_impl,local_90.int_value_,uVar11 & 0xffffffff);
        break;
      case 0x2c:
        this->double_counter_value_ = (double)local_90.int_value_;
        break;
      case 0x2d:
        iVar7._M_current =
             (this->extra_double_counter_track_uuids_).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (this->extra_double_counter_track_uuids_).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<>
                    (local_60,iVar7);
          puVar15 = (this->extra_double_counter_track_uuids_).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        }
        else {
          *iVar7._M_current = 0;
          puVar15 = iVar7._M_current + 1;
          (this->extra_double_counter_track_uuids_).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar15;
        }
LAB_00249bb2:
        puVar15[-1] = local_90.int_value_;
        break;
      case 0x2e:
        __position._M_current =
             (this->extra_double_counter_values_).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        if (__position._M_current ==
            (this->extra_double_counter_values_).super__Vector_base<double,_std::allocator<double>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<>(local_68,__position);
          pdVar14 = (this->extra_double_counter_values_).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        }
        else {
          *__position._M_current = 0.0;
          pdVar14 = __position._M_current + 1;
          (this->extra_double_counter_values_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_finish = pdVar14;
        }
        pdVar14[-1] = (double)local_90.int_value_;
      }
      do {
        if (puVar12 <= raw) goto switchD_00249672_caseD_3;
        bVar1 = (byte)*raw;
        uVar11 = (ulong)(uint)bVar1;
        puVar18 = (ulong *)((long)raw + 1);
        if ((char)bVar1 < '\0') {
          uVar11 = (ulong)(bVar1 & 0x7f);
          lVar10 = 7;
          do {
            if ((puVar12 <= puVar18) || (0x38 < lVar10 - 7U)) goto switchD_00249672_caseD_3;
            uVar9 = *puVar18;
            puVar18 = (ulong *)((long)puVar18 + 1);
            uVar11 = uVar11 | (ulong)((byte)uVar9 & 0x7f) << ((byte)lVar10 & 0x3f);
            lVar10 = lVar10 + 7;
          } while ((char)(byte)uVar9 < '\0');
        }
        uVar9 = uVar11 >> 3;
        if (((uint)uVar9 == 0) || (puVar12 <= puVar18)) goto switchD_00249672_caseD_3;
        switch((uint)uVar11 & 7) {
        case 0:
          uVar17 = 0;
          uVar13 = 0;
          while( true ) {
            puVar21 = (ulong *)((long)puVar18 + 1);
            uVar17 = (ulong)((byte)*puVar18 & 0x7f) << ((byte)uVar13 & 0x3f) | uVar17;
            if (-1 < (char)(byte)*puVar18) break;
            if ((puVar12 <= puVar21) ||
               (bVar8 = 0x38 < uVar13, uVar13 = uVar13 + 7, puVar18 = puVar21, bVar8))
            goto switchD_00249672_caseD_3;
          }
          uVar13 = uVar17 & 0xffffffff00000000;
          break;
        case 1:
          puVar21 = puVar18 + 1;
          if (puVar12 < puVar21) goto switchD_00249672_caseD_3;
          uVar17 = *puVar18;
          uVar13 = uVar17 & 0xffffffff00000000;
          break;
        case 2:
          puVar18 = (ulong *)((long)puVar18 + 1);
          uVar19 = 0;
          uVar17 = 0;
          puVar21 = puVar18;
          while (uVar19 = (ulong)(*(byte *)((long)puVar21 + -1) & 0x7f) << ((byte)uVar17 & 0x3f) |
                          uVar19, (char)*(byte *)((long)puVar21 + -1) < '\0') {
            if (puVar12 <= puVar21) goto switchD_00249672_caseD_3;
            puVar21 = (ulong *)((long)puVar21 + 1);
            puVar18 = (ulong *)((long)puVar18 + 1);
            bVar8 = 0x38 < uVar17;
            uVar17 = uVar17 + 7;
            if (bVar8) goto switchD_00249672_caseD_3;
          }
          if (uVar19 <= (ulong)((long)puVar12 - (long)puVar18)) {
            uVar13 = (ulong)puVar18 & 0xffffffff00000000;
            puVar21 = (ulong *)((long)puVar21 + uVar19);
            uVar17 = (ulong)puVar18 & 0xffffffff;
            goto LAB_00249d46;
          }
        default:
          goto switchD_00249672_caseD_3;
        case 5:
          puVar21 = (ulong *)((long)puVar18 + 4);
          if (puVar12 < puVar21) goto switchD_00249672_caseD_3;
          uVar17 = (ulong)(uint)*puVar18;
          uVar13 = 0;
        }
        uVar19 = 0;
LAB_00249d46:
        raw = puVar21;
      } while ((0xffff < (uint)uVar9) || (0xfffffff < uVar19));
      local_90.int_value_ = uVar13 | uVar17 & 0xffffffff;
      uVar17 = uVar9 << 0x20 | uVar19;
      uVar11 = uVar17 | (uVar11 & 7) << 0x30;
      local_90.size_ = (uint32_t)uVar19;
      local_90.type_ = (uint8_t)(uVar11 >> 0x30);
      local_90.id_ = (uint16_t)(uVar17 >> 0x20);
    } while ((short)uVar9 != 0);
  }
switchD_00249672_caseD_3:
  return puVar12 == (ulong *)raw;
}

Assistant:

bool TrackEvent::ParseFromArray(const void* raw, size_t size) {
  category_iids_.clear();
  categories_.clear();
  extra_counter_track_uuids_.clear();
  extra_counter_values_.clear();
  extra_double_counter_track_uuids_.clear();
  extra_double_counter_values_.clear();
  flow_ids_.clear();
  terminating_flow_ids_.clear();
  debug_annotations_.clear();
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 3 /* category_iids */:
        category_iids_.emplace_back();
        field.get(&category_iids_.back());
        break;
      case 22 /* categories */:
        categories_.emplace_back();
        field.get(&categories_.back());
        break;
      case 10 /* name_iid */:
        field.get(&name_iid_);
        break;
      case 23 /* name */:
        field.get(&name_);
        break;
      case 9 /* type */:
        field.get(&type_);
        break;
      case 11 /* track_uuid */:
        field.get(&track_uuid_);
        break;
      case 30 /* counter_value */:
        field.get(&counter_value_);
        break;
      case 44 /* double_counter_value */:
        field.get(&double_counter_value_);
        break;
      case 31 /* extra_counter_track_uuids */:
        extra_counter_track_uuids_.emplace_back();
        field.get(&extra_counter_track_uuids_.back());
        break;
      case 12 /* extra_counter_values */:
        extra_counter_values_.emplace_back();
        field.get(&extra_counter_values_.back());
        break;
      case 45 /* extra_double_counter_track_uuids */:
        extra_double_counter_track_uuids_.emplace_back();
        field.get(&extra_double_counter_track_uuids_.back());
        break;
      case 46 /* extra_double_counter_values */:
        extra_double_counter_values_.emplace_back();
        field.get(&extra_double_counter_values_.back());
        break;
      case 36 /* flow_ids */:
        flow_ids_.emplace_back();
        field.get(&flow_ids_.back());
        break;
      case 42 /* terminating_flow_ids */:
        terminating_flow_ids_.emplace_back();
        field.get(&terminating_flow_ids_.back());
        break;
      case 4 /* debug_annotations */:
        debug_annotations_.emplace_back();
        debug_annotations_.back().ParseFromArray(field.data(), field.size());
        break;
      case 5 /* task_execution */:
        (*task_execution_).ParseFromArray(field.data(), field.size());
        break;
      case 21 /* log_message */:
        (*log_message_).ParseFromArray(field.data(), field.size());
        break;
      case 24 /* cc_scheduler_state */:
        (*cc_scheduler_state_).ParseFromArray(field.data(), field.size());
        break;
      case 25 /* chrome_user_event */:
        (*chrome_user_event_).ParseFromArray(field.data(), field.size());
        break;
      case 26 /* chrome_keyed_service */:
        (*chrome_keyed_service_).ParseFromArray(field.data(), field.size());
        break;
      case 27 /* chrome_legacy_ipc */:
        (*chrome_legacy_ipc_).ParseFromArray(field.data(), field.size());
        break;
      case 28 /* chrome_histogram_sample */:
        (*chrome_histogram_sample_).ParseFromArray(field.data(), field.size());
        break;
      case 29 /* chrome_latency_info */:
        (*chrome_latency_info_).ParseFromArray(field.data(), field.size());
        break;
      case 32 /* chrome_frame_reporter */:
        (*chrome_frame_reporter_).ParseFromArray(field.data(), field.size());
        break;
      case 39 /* chrome_application_state_info */:
        (*chrome_application_state_info_).ParseFromArray(field.data(), field.size());
        break;
      case 40 /* chrome_renderer_scheduler_state */:
        (*chrome_renderer_scheduler_state_).ParseFromArray(field.data(), field.size());
        break;
      case 41 /* chrome_window_handle_event_info */:
        (*chrome_window_handle_event_info_).ParseFromArray(field.data(), field.size());
        break;
      case 43 /* chrome_content_settings_event_info */:
        (*chrome_content_settings_event_info_).ParseFromArray(field.data(), field.size());
        break;
      case 33 /* source_location */:
        (*source_location_).ParseFromArray(field.data(), field.size());
        break;
      case 34 /* source_location_iid */:
        field.get(&source_location_iid_);
        break;
      case 35 /* chrome_message_pump */:
        (*chrome_message_pump_).ParseFromArray(field.data(), field.size());
        break;
      case 38 /* chrome_mojo_event_info */:
        (*chrome_mojo_event_info_).ParseFromArray(field.data(), field.size());
        break;
      case 1 /* timestamp_delta_us */:
        field.get(&timestamp_delta_us_);
        break;
      case 16 /* timestamp_absolute_us */:
        field.get(&timestamp_absolute_us_);
        break;
      case 2 /* thread_time_delta_us */:
        field.get(&thread_time_delta_us_);
        break;
      case 17 /* thread_time_absolute_us */:
        field.get(&thread_time_absolute_us_);
        break;
      case 8 /* thread_instruction_count_delta */:
        field.get(&thread_instruction_count_delta_);
        break;
      case 20 /* thread_instruction_count_absolute */:
        field.get(&thread_instruction_count_absolute_);
        break;
      case 6 /* legacy_event */:
        (*legacy_event_).ParseFromArray(field.data(), field.size());
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}